

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

u8 read_joyp_p10_p13(Emulator *e)

{
  JoypadSelect JVar1;
  Bool BVar2;
  Bool BVar3;
  byte bVar4;
  byte bVar5;
  Bool BVar6;
  Bool BVar7;
  Bool BVar8;
  
  JVar1 = (e->state).joyp.joypad_select;
  bVar4 = (e->state).sgb.current_player;
  if (JVar1 == JOYPAD_SELECT_NONE) {
    bVar5 = ~bVar4 | 0xfc;
  }
  else {
    bVar5 = 0xff;
    if (bVar4 == 0) {
      if (JVar1 < JOYPAD_SELECT_DPAD) {
        bVar4 = (byte)(e->state).joyp.buttons.A & 1 |
                ((byte)(e->state).joyp.buttons.start & 1) * '\b' +
                ((byte)(e->state).joyp.buttons.select & 1) * '\x04' +
                ((byte)(e->state).joyp.buttons.B & 1) * '\x02';
      }
      else {
        bVar4 = 0;
      }
      BVar7 = (e->state).joyp.buttons.left;
      BVar2 = (e->state).joyp.buttons.right;
      BVar3 = (e->state).joyp.buttons.down;
      BVar6 = (e->state).joyp.buttons.up;
      if ((e->config).allow_simulataneous_dpad_opposites == FALSE) {
        if (BVar7 == FALSE || BVar2 == FALSE) {
          BVar8 = FALSE;
          if (BVar3 == FALSE) {
            BVar8 = BVar6;
          }
          if (BVar6 != FALSE) {
            BVar6 = BVar8;
          }
        }
        else {
          BVar7 = FALSE;
        }
      }
      if ((JVar1 & ~JOYPAD_SELECT_DPAD) == JOYPAD_SELECT_BOTH) {
        bVar4 = bVar4 | ((byte)BVar2 & 1) + ((byte)BVar3 & 1) * '\b' + ((byte)BVar7 & 1) * '\x02' +
                        ((byte)BVar6 & 1) * '\x04';
      }
      return ~bVar4;
    }
  }
  return bVar5;
}

Assistant:

static u8 read_joyp_p10_p13(Emulator* e) {
  if (JOYP.joypad_select == JOYPAD_SELECT_NONE) {
    return ~(SGB.current_player & 3);
  }
  if (SGB.current_player != 0) { return ~0; }  // Ignore other controllers.

  u8 result = 0;
  if (JOYP.joypad_select == JOYPAD_SELECT_BUTTONS ||
      JOYP.joypad_select == JOYPAD_SELECT_BOTH) {
    result |= PACK(JOYP.buttons.start, JOYP_BUTTON_START) |
              PACK(JOYP.buttons.select, JOYP_BUTTON_SELECT) |
              PACK(JOYP.buttons.B, JOYP_BUTTON_B) |
              PACK(JOYP.buttons.A, JOYP_BUTTON_A);
  }

  Bool left = JOYP.buttons.left;
  Bool right = JOYP.buttons.right;
  Bool up = JOYP.buttons.up;
  Bool down = JOYP.buttons.down;
  if (!e->config.allow_simulataneous_dpad_opposites) {
    if (left && right) {
      left = FALSE;
    } else if (up && down) {
      up = FALSE;
    }
  }

  if (JOYP.joypad_select == JOYPAD_SELECT_DPAD ||
      JOYP.joypad_select == JOYPAD_SELECT_BOTH) {
    result |= PACK(down, JOYP_DPAD_DOWN) | PACK(up, JOYP_DPAD_UP) |
              PACK(left, JOYP_DPAD_LEFT) | PACK(right, JOYP_DPAD_RIGHT);
  }
  /* The bits are low when the buttons are pressed. */
  return ~result;
}